

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O2

TypeDescriptor * lessThanOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  bool bVar1;
  NumberDescriptor *this;
  ostream *poVar2;
  double value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (leftValue->_type == STRING) {
    if (rightValue->_type != STRING) goto LAB_0010e72b;
    this = (NumberDescriptor *)operator_new(0x60);
    std::__cxx11::string::string((string *)&local_38,(string *)&leftValue->_string);
    std::__cxx11::string::string((string *)&bStack_58,(string *)&rightValue->_string);
    bVar1 = std::operator<(&local_38,&bStack_58);
    if (bVar1) {
      value = 1.0;
    }
    else {
      value = 0.0;
    }
    NumberDescriptor::NumberDescriptor(this,value);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    if ((leftValue->_type != NUMBER) || (rightValue->_type != NUMBER)) {
LAB_0010e72b:
      poVar2 = std::operator<<((ostream *)&std::cout,"Unknown type. Terminating...");
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(2);
    }
    this = (NumberDescriptor *)operator_new(0x60);
    NumberDescriptor::NumberDescriptor
              (this,(double)(-(ulong)(leftValue->_number < rightValue->_number) & 0x3ff0000000000000
                            ));
  }
  return &this->super_TypeDescriptor;
}

Assistant:

TypeDescriptor *lessThanOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
       && rightValue->type() == TypeDescriptor::NUMBER){
        auto *numLess = new  NumberDescriptor(leftValue->getNumber() < rightValue->getNumber() ? 1.0 : 0.0);
        //std::cout << "TypeDescriptor *lessThanOperator: " << leftValue->getNumber() << " < " << rightValue->getNumber() << std::endl;
        return numLess;
    }else if(leftValue->type() == TypeDescriptor::STRING
             && rightValue->type() == TypeDescriptor::STRING ){
        auto *stringLess = new  NumberDescriptor(leftValue->getString()  < rightValue->getString()  ? 1.0 : 0.0);
        //std::cout << "TypeDescriptor *lessThanOperator: " << leftValue->getString()  << " <  " << rightValue->getString()  << std::endl;
        return stringLess;
    }else{
        std::cout << "Unknown type. Terminating..." << std::endl;
        exit(2);
    }
}